

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FigureTests-v4.cpp
# Opt level: O1

void __thiscall
v4::FigureTests_v4_square_clone_method_called_via_base_class_return_pointer_of_type_Figure_Test::
TestBody(FigureTests_v4_square_clone_method_called_via_base_class_return_pointer_of_type_Figure_Test
         *this)

{
  long *plVar1;
  AssertionResult gtest_ar_;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_10;
  
  plVar1 = (long *)operator_new(0x10);
  *plVar1 = (long)&PTR__Figure_00165d98;
  plVar1[1] = 0;
  local_10.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_10,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  (**(code **)(*plVar1 + 8))(plVar1);
  return;
}

Assistant:

Square* clone() const override     // return type is Square* instead of Figure* (Covariant Return Type)
    {
        return new Square(*this);
    }